

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hardswish.cpp
# Opt level: O0

int __thiscall ncnn::HardSwish::forward_inplace(HardSwish *this,Mat *bottom_top_blob,Option *opt)

{
  float fVar1;
  long in_RSI;
  long in_RDI;
  int i;
  float *ptr;
  int q;
  int size;
  int channels;
  int h;
  int w;
  Mat *this_00;
  Mat *in_stack_ffffffffffffff68;
  int local_88;
  Mat local_78;
  Mat *local_38;
  int local_2c;
  int local_28;
  int local_24;
  int local_20;
  int local_1c;
  
  local_1c = *(int *)(in_RSI + 0x2c);
  local_20 = *(int *)(in_RSI + 0x30);
  local_24 = *(int *)(in_RSI + 0x34);
  local_28 = local_1c * local_20;
  for (local_2c = 0; local_2c < local_24; local_2c = local_2c + 1) {
    this_00 = &local_78;
    Mat::channel(in_stack_ffffffffffffff68,(int)((ulong)this_00 >> 0x20));
    in_stack_ffffffffffffff68 = (Mat *)Mat::operator_cast_to_float_(this_00);
    Mat::~Mat((Mat *)0x1dab37);
    for (local_88 = 0; local_88 < local_28; local_88 = local_88 + 1) {
      if (*(float *)(in_RDI + 0xc0) <=
          *(float *)((long)&in_stack_ffffffffffffff68->data + (long)local_88 * 4)) {
        fVar1 = *(float *)((long)&in_stack_ffffffffffffff68->data + (long)local_88 * 4);
        if (fVar1 < *(float *)(in_RDI + 0xc4) || fVar1 == *(float *)(in_RDI + 0xc4)) {
          *(float *)((long)&in_stack_ffffffffffffff68->data + (long)local_88 * 4) =
               *(float *)((long)&in_stack_ffffffffffffff68->data + (long)local_88 * 4) *
               (*(float *)((long)&in_stack_ffffffffffffff68->data + (long)local_88 * 4) *
                *(float *)(in_RDI + 0xb8) + *(float *)(in_RDI + 0xbc));
        }
      }
      else {
        *(float *)((long)&in_stack_ffffffffffffff68->data + (long)local_88 * 4) = 0.0;
      }
    }
    local_38 = in_stack_ffffffffffffff68;
  }
  return 0;
}

Assistant:

int HardSwish::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int channels = bottom_top_blob.c;
    int size = w * h;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q=0; q<channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        for (int i=0; i<size; i++)
        {
            if (ptr[i] < lower)
                ptr[i] = 0.f;
            else if (ptr[i] > upper) ;
            else
                ptr[i] = ptr[i] * (ptr[i] * alpha + beta);
        }
    }

    return 0;
}